

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O0

CallOrCast * __thiscall
soul::PoolAllocator::
allocate<soul::AST::CallOrCast,soul::AST::Expression&,soul::pool_ptr<soul::AST::CommaSeparatedList>&,bool>
          (PoolAllocator *this,Expression *args,pool_ptr<soul::AST::CommaSeparatedList> *args_1,
          bool *args_2)

{
  DestructorFn *pDVar1;
  Context *this_00;
  _lambda_void___1_ local_4d [13];
  pool_ptr<soul::AST::CommaSeparatedList> local_40;
  CallOrCast *local_38;
  CallOrCast *newObject;
  PoolItem *newItem;
  bool *args_local_2;
  pool_ptr<soul::AST::CommaSeparatedList> *args_local_1;
  Expression *args_local;
  PoolAllocator *this_local;
  
  newItem = (PoolItem *)args_2;
  args_local_2 = (bool *)args_1;
  args_local_1 = (pool_ptr<soul::AST::CommaSeparatedList> *)args;
  args_local = (Expression *)this;
  newObject = (CallOrCast *)allocateSpaceForObject(this,0x48);
  this_00 = &(newObject->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject.
             context;
  local_40.object = *(CommaSeparatedList **)args_local_2;
  AST::CallOrCast::CallOrCast
            ((CallOrCast *)this_00,(Expression *)args_local_1,&local_40,
             (bool)((byte)newItem->size & 1));
  pool_ptr<soul::AST::CommaSeparatedList>::~pool_ptr(&local_40);
  local_38 = (CallOrCast *)this_00;
  pDVar1 = allocate(soul::AST::Expression&,soul::pool_ptr&,bool&&)::{lambda(void*)#1}::
           operator_cast_to_function_pointer(local_4d);
  *(DestructorFn **)
   &(newObject->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject.objectType =
       pDVar1;
  return local_38;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }